

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.cxx
# Opt level: O2

bool cmSetSourceFilesPropertiesCommand::RunCommand
               (cmMakefile *mf,const_iterator filebeg,const_iterator fileend,const_iterator propbeg,
               const_iterator propend,string *errors)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  bool bVar1;
  undefined8 uVar2;
  cmSourceFile *this;
  value_type *__x_00;
  ulong uVar3;
  ulong uVar4;
  allocator local_8d;
  undefined4 local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propertyPairs;
  
  propertyPairs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  propertyPairs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  propertyPairs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c = 0;
  for (; propbeg._M_current != propend._M_current; propbeg._M_current = propbeg._M_current + 1) {
    bVar1 = std::operator==(propbeg._M_current,"ABSTRACT");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_88,"ABSTRACT",&local_8d);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&propertyPairs
                 ,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string((string *)&local_88,"1",&local_8d);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&propertyPairs
                 ,&local_88);
LAB_002a94cf:
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      bVar1 = std::operator==(propbeg._M_current,"WRAP_EXCLUDE");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_88,"WRAP_EXCLUDE",&local_8d);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &propertyPairs,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::string((string *)&local_88,"1",&local_8d);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &propertyPairs,&local_88);
        goto LAB_002a94cf;
      }
      bVar1 = std::operator==(propbeg._M_current,"GENERATED");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_88,"GENERATED",&local_8d);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &propertyPairs,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::string((string *)&local_88,"1",&local_8d);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &propertyPairs,&local_88);
        uVar2 = std::__cxx11::string::~string((string *)&local_88);
        local_8c = (undefined4)CONCAT71((int7)((ulong)uVar2 >> 8),1);
      }
      else {
        bVar1 = std::operator==(propbeg._M_current,"COMPILE_FLAGS");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_88,"COMPILE_FLAGS",&local_8d);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &propertyPairs,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          propbeg._M_current = propbeg._M_current + 1;
          if (propbeg._M_current == propend._M_current) goto LAB_002a9723;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&propertyPairs,propbeg._M_current);
        }
        else {
          bVar1 = std::operator==(propbeg._M_current,"OBJECT_DEPENDS");
          if (!bVar1) {
            bVar1 = std::operator==(propbeg._M_current,"PROPERTIES");
            if (!bVar1) goto LAB_002a9723;
            goto LAB_002a961b;
          }
          std::__cxx11::string::string((string *)&local_88,"OBJECT_DEPENDS",&local_8d);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &propertyPairs,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          propbeg._M_current = propbeg._M_current + 1;
          if (propbeg._M_current == propend._M_current) goto LAB_002a9723;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&propertyPairs,propbeg._M_current);
        }
      }
    }
  }
LAB_002a9677:
  bVar1 = (bool)((byte)local_8c & 1);
  for (; filebeg._M_current != fileend._M_current; filebeg._M_current = filebeg._M_current + 1) {
    this = cmMakefile::GetOrCreateSource(mf,filebeg._M_current,bVar1);
    if (this != (cmSourceFile *)0x0) {
      uVar4 = 1;
      while( true ) {
        uVar3 = (ulong)((int)uVar4 - 1);
        if ((ulong)((long)propertyPairs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)propertyPairs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) break;
        cmSourceFile::SetProperty
                  (this,propertyPairs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar3,
                   propertyPairs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p);
        uVar4 = (ulong)((int)uVar4 + 2);
      }
    }
  }
  bVar1 = true;
LAB_002a96e6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&propertyPairs);
  return bVar1;
LAB_002a961b:
  __x_00 = propbeg._M_current + 2;
  __x = propbeg._M_current + 1;
  if (__x == propend._M_current) goto LAB_002a9677;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&propertyPairs,__x);
  bVar1 = std::operator==(__x,"GENERATED");
  if (__x_00 != propend._M_current && bVar1) {
    bVar1 = cmSystemTools::IsOn((__x_00->_M_dataplus)._M_p);
    local_8c = CONCAT31((int3)((uint)local_8c >> 8),(byte)local_8c | bVar1);
  }
  if (__x_00 == propend._M_current) goto LAB_002a9723;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&propertyPairs,__x_00);
  propbeg._M_current = __x_00;
  goto LAB_002a961b;
LAB_002a9723:
  std::__cxx11::string::assign((char *)errors);
  bVar1 = false;
  goto LAB_002a96e6;
}

Assistant:

bool cmSetSourceFilesPropertiesCommand
::RunCommand(cmMakefile *mf,
             std::vector<std::string>::const_iterator filebeg,
             std::vector<std::string>::const_iterator fileend,
             std::vector<std::string>::const_iterator propbeg,
             std::vector<std::string>::const_iterator propend,
             std::string &errors)
{
  std::vector<std::string> propertyPairs;
  bool generated = false;
  std::vector<std::string>::const_iterator j;
  // build the property pairs
  for(j= propbeg; j != propend;++j)
    {
    // old style allows for specifier before PROPERTIES keyword
    if(*j == "ABSTRACT")
      {
      propertyPairs.push_back("ABSTRACT");
      propertyPairs.push_back("1");
      }
    else if(*j == "WRAP_EXCLUDE")
      {
      propertyPairs.push_back("WRAP_EXCLUDE");
      propertyPairs.push_back("1");
      }
    else if(*j == "GENERATED")
      {
      generated = true;
      propertyPairs.push_back("GENERATED");
      propertyPairs.push_back("1");
      }
    else if(*j == "COMPILE_FLAGS")
      {
      propertyPairs.push_back("COMPILE_FLAGS");
      ++j;
      if(j == propend)
        {
        errors = "called with incorrect number of arguments "
          "COMPILE_FLAGS with no flags";
        return false;
        }
      propertyPairs.push_back(*j);
      }
    else if(*j == "OBJECT_DEPENDS")
      {
      propertyPairs.push_back("OBJECT_DEPENDS");
      ++j;
      if(j == propend)
        {
        errors = "called with incorrect number of arguments "
          "OBJECT_DEPENDS with no dependencies";
        return false;
        }
      propertyPairs.push_back(*j);
      }
    else if(*j == "PROPERTIES")
      {
      // now loop through the rest of the arguments, new style
      ++j;
      while (j != propend)
        {
        propertyPairs.push_back(*j);
        if(*j == "GENERATED")
          {
          ++j;
          if(j != propend && cmSystemTools::IsOn(j->c_str()))
            {
            generated = true;
            }
          }
        else
          {
          ++j;
          }
        if(j == propend)
          {
          errors = "called with incorrect number of arguments.";
          return false;
          }
        propertyPairs.push_back(*j);
        ++j;
        }
      // break out of the loop because j is already == end
      break;
      }
    else
      {
      errors = "called with illegal arguments, maybe missing a "
        "PROPERTIES specifier?";
      return false;
      }
    }

  // now loop over all the files
  for(j= filebeg; j != fileend;++j)
    {
    // get the source file
    cmSourceFile* sf =
      mf->GetOrCreateSource(*j, generated);
    if(sf)
      {
      // now loop through all the props and set them
      unsigned int k;
      for (k = 0; k < propertyPairs.size(); k = k + 2)
        {
        sf->SetProperty(propertyPairs[k],propertyPairs[k+1].c_str());
        }
      }
    }
  return true;
}